

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_yaml.cpp
# Opt level: O2

Language * Omega_h::yaml::build_language(void)

{
  Language *in_RDI;
  allocator local_52;
  allocator local_51;
  undefined1 local_50 [64];
  
  (in_RDI->productions).
  super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->productions).
  super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->tokens).
  super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->productions).
  super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->tokens).
  super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->tokens).
  super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  build_productions(&in_RDI->productions);
  std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::resize
            (&in_RDI->tokens,0x14);
  std::__cxx11::string::string((string *)local_50,"NEWLINE",&local_51);
  std::__cxx11::string::string((string *)(local_50 + 0x20),"((#[^\r\n]*)?\r?\n[ \t]*)+",&local_52);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start,(Token *)local_50);
  Language::Token::~Token((Token *)local_50);
  std::__cxx11::string::string((string *)local_50,"INDENT",&local_51);
  std::__cxx11::string::string((string *)(local_50 + 0x20),"((#[^\r\n]*)?\r?\n[ \t]*)+",&local_52);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 1,(Token *)local_50);
  Language::Token::~Token((Token *)local_50);
  std::__cxx11::string::string((string *)local_50,"DEDENT",&local_51);
  std::__cxx11::string::string((string *)(local_50 + 0x20),"((#[^\r\n]*)?\r?\n[ \t]*)+",&local_52);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 2,(Token *)local_50);
  Language::Token::~Token((Token *)local_50);
  std::__cxx11::string::string((string *)local_50,"WS",&local_51);
  std::__cxx11::string::string((string *)(local_50 + 0x20),"[ \t]",&local_52);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 3,(Token *)local_50);
  Language::Token::~Token((Token *)local_50);
  std::__cxx11::string::string((string *)local_50,":",&local_51);
  std::__cxx11::string::string((string *)(local_50 + 0x20),":",&local_52);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 4,(Token *)local_50);
  Language::Token::~Token((Token *)local_50);
  std::__cxx11::string::string((string *)local_50,".",&local_51);
  std::__cxx11::string::string((string *)(local_50 + 0x20),"\\.",&local_52);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 5,(Token *)local_50);
  Language::Token::~Token((Token *)local_50);
  std::__cxx11::string::string((string *)local_50,"-",&local_51);
  std::__cxx11::string::string((string *)(local_50 + 0x20),"\\-",&local_52);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 6,(Token *)local_50);
  Language::Token::~Token((Token *)local_50);
  std::__cxx11::string::string((string *)local_50,"\"",&local_51);
  std::__cxx11::string::string((string *)(local_50 + 0x20),"\"",&local_52);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 7,(Token *)local_50);
  Language::Token::~Token((Token *)local_50);
  std::__cxx11::string::string((string *)local_50,"\'",&local_51);
  std::__cxx11::string::string((string *)(local_50 + 0x20),"\'",&local_52);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 8,(Token *)local_50);
  Language::Token::~Token((Token *)local_50);
  std::__cxx11::string::string((string *)local_50,"\\",&local_51);
  std::__cxx11::string::string((string *)(local_50 + 0x20),"\\\\",&local_52);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 9,(Token *)local_50);
  Language::Token::~Token((Token *)local_50);
  std::__cxx11::string::string((string *)local_50,"|",&local_51);
  std::__cxx11::string::string((string *)(local_50 + 0x20),"\\|",&local_52);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 10,(Token *)local_50);
  Language::Token::~Token((Token *)local_50);
  std::__cxx11::string::string((string *)local_50,"[",&local_51);
  std::__cxx11::string::string((string *)(local_50 + 0x20),"\\[",&local_52);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xb,(Token *)local_50);
  Language::Token::~Token((Token *)local_50);
  std::__cxx11::string::string((string *)local_50,"]",&local_51);
  std::__cxx11::string::string((string *)(local_50 + 0x20),"\\]",&local_52);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xc,(Token *)local_50);
  Language::Token::~Token((Token *)local_50);
  std::__cxx11::string::string((string *)local_50,"{",&local_51);
  std::__cxx11::string::string((string *)(local_50 + 0x20),"{",&local_52);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xd,(Token *)local_50);
  Language::Token::~Token((Token *)local_50);
  std::__cxx11::string::string((string *)local_50,"}",&local_51);
  std::__cxx11::string::string((string *)(local_50 + 0x20),"}",&local_52);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xe,(Token *)local_50);
  Language::Token::~Token((Token *)local_50);
  std::__cxx11::string::string((string *)local_50,">",&local_51);
  std::__cxx11::string::string((string *)(local_50 + 0x20),">",&local_52);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xf,(Token *)local_50);
  Language::Token::~Token((Token *)local_50);
  std::__cxx11::string::string((string *)local_50,",",&local_51);
  std::__cxx11::string::string((string *)(local_50 + 0x20),",",&local_52);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0x10,(Token *)local_50);
  Language::Token::~Token((Token *)local_50);
  std::__cxx11::string::string((string *)local_50,"%",&local_51);
  std::__cxx11::string::string((string *)(local_50 + 0x20),"%",&local_52);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0x11,(Token *)local_50);
  Language::Token::~Token((Token *)local_50);
  std::__cxx11::string::string((string *)local_50,"!",&local_51);
  std::__cxx11::string::string((string *)(local_50 + 0x20),"!",&local_52);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0x12,(Token *)local_50);
  Language::Token::~Token((Token *)local_50);
  std::__cxx11::string::string((string *)local_50,"OTHERCHAR",&local_51);
  std::__cxx11::string::string
            ((string *)(local_50 + 0x20),"[^ \t:\\.\\-\"\'\\\\\\|\\[\\]{}>,%#!\n\r]",&local_52);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0x13,(Token *)local_50);
  Language::Token::~Token((Token *)local_50);
  return in_RDI;
}

Assistant:

Language build_language() {
  Language out;
  auto& prods = out.productions;
  auto& toks = out.tokens;
  build_productions(prods);
  toks.resize(NTOKS);
  toks[TOK_NEWLINE] = {"NEWLINE", "((#[^\r\n]*)?\r?\n[ \t]*)+"};
  toks[TOK_INDENT] = {"INDENT", "((#[^\r\n]*)?\r?\n[ \t]*)+"};
  toks[TOK_DEDENT] = {"DEDENT", "((#[^\r\n]*)?\r?\n[ \t]*)+"};
  toks[TOK_SPACE] = {"WS", "[ \t]"};
  toks[TOK_COLON] = {":", ":"};
  toks[TOK_DOT] = {".", "\\."};
  toks[TOK_DASH] = {"-", "\\-"};
  toks[TOK_DQUOT] = {"\"", "\""};
  toks[TOK_SQUOT] = {"'", "'"};
  toks[TOK_SLASH] = {"\\", "\\\\"};
  toks[TOK_PIPE] = {"|", "\\|"};
  toks[TOK_LSQUARE] = {"[", "\\["};
  toks[TOK_RSQUARE] = {"]", "\\]"};
  toks[TOK_LCURLY] = {"{", "{"};
  toks[TOK_RCURLY] = {"}", "}"};
  toks[TOK_RANGLE] = {">", ">"};
  toks[TOK_COMMA] = {",", ","};
  toks[TOK_PERCENT] = {"%", "%"};
  toks[TOK_EXCL] = {"!", "!"};
  toks[TOK_OTHER] = {"OTHERCHAR", "[^ \t:\\.\\-\"'\\\\\\|\\[\\]{}>,%#!\n\r]"};
  return out;
}